

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Environmental_Process_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Environmental_Process_PDU *this)

{
  ostream *poVar1;
  pointer pKVar2;
  KString *pKVar3;
  ostream *poVar4;
  ulong uVar5;
  ushort uVar6;
  pointer pKVar7;
  KStringStream ss;
  char local_3a9;
  KString *local_3a8;
  KString local_3a0;
  long *local_380;
  long local_378;
  long local_370 [2];
  KString local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-Environmental Process PDU-\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Environmental Process ID:\n",0x1a);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3a0,&this->m_EnvProcID);
  local_3a8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  local_3a9 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_3a9,1);
  if (local_3a0._M_string_length != 0) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      local_3a9 = local_3a0._M_dataplus._M_p[uVar5];
      if ((local_3a0._M_string_length - 1 == uVar5) || (local_3a9 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_3a9,1);
      }
      else {
        local_3a9 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_3a9,1);
        local_3a9 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_3a9,1);
      }
      uVar5 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar5 < local_3a0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Environment Type: ",0x12);
  DATA_TYPE::EnvironmentType::GetAsString_abi_cxx11_((KString *)local_340,&this->m_EnvType);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Model Type:       ",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Environment Status:\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tLast PDU: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tActive: ",9);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Number Of Environment Records: ",0x1f);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Sequence Number: ",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if ((ostream *)local_340._0_8_ != poVar1) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  pKVar7 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar7 != pKVar2) {
    do {
      (*(pKVar7->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar1) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar2);
  }
  pKVar3 = local_3a8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar3;
}

Assistant:

KString Environmental_Process_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Environmental Process PDU-\n"
       << "Environmental Process ID:\n"
       << IndentString( m_EnvProcID.GetAsString(), 1 )
       << "Environment Type: "             << m_EnvType.GetAsString()
       << "Model Type:       "             << ( KUINT16 )m_ui8ModelType     << "\n"
       << "Environment Status:\n"
       << "\tLast PDU: "                   << ( KUINT16 )m_ui8EnvStatusBit0 << "\n"
       << "\tActive: "                     << ( KUINT16 )m_ui8EnvStatusBit1 << "\n"
       << "Number Of Environment Records: " << m_ui16NumEnvRec              << "\n"
       << "Sequence Number: "              << m_ui16SeqNum                  << "\n";

    vector<EnvironmentRecordPtr>::const_iterator citr = m_vEnvRecords.begin();
    vector<EnvironmentRecordPtr>::const_iterator citrEnd = m_vEnvRecords.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}